

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O3

GArray * g_array_insert_vals(GArray *farray,guint index_,gconstpointer data,guint len)

{
  int iVar1;
  guint gVar2;
  
  if (len != 0) {
    if (index_ < farray->len) {
      g_array_maybe_expand((GRealArray *)farray,len);
      iVar1 = *(int *)&farray[1].data;
      memmove(farray->data + (len + index_) * iVar1,farray->data + iVar1 * index_,
              (ulong)((farray->len - index_) * iVar1));
      memcpy(farray->data + index_ * *(int *)&farray[1].data,data,
             (ulong)(*(int *)&farray[1].data * len));
      gVar2 = len + farray->len;
      farray->len = gVar2;
      if (((ulong)farray[1].data & 0x100000000) != 0) {
        memset(farray->data + gVar2 * *(uint *)&farray[1].data,0,(ulong)*(uint *)&farray[1].data);
      }
    }
    else {
      g_array_maybe_expand((GRealArray *)farray,(len + index_) - farray->len);
      g_array_set_size(farray,index_);
      g_array_append_vals(farray,data,len);
    }
  }
  return farray;
}

Assistant:

GArray* g_array_insert_vals (GArray        *farray,
        guint          index_,
        gconstpointer  data,
        guint          len)
{
    GRealArray *array = (GRealArray*) farray;

    g_return_val_if_fail (array, NULL);

    if (len == 0)
        return farray;

    /* Is the index off the end of the array, and hence do we need to over-allocate
     * and clear some elements? */
    if (index_ >= array->len)
    {
        g_array_maybe_expand (array, index_ - array->len + len);
        return g_array_append_vals (g_array_set_size (farray, index_), data, len);
    }

    g_array_maybe_expand (array, len);

    memmove (g_array_elt_pos (array, len + index_),
            g_array_elt_pos (array, index_),
            g_array_elt_len (array, array->len - index_));

    memcpy (g_array_elt_pos (array, index_), data, g_array_elt_len (array, len));

    array->len += len;

    g_array_zero_terminate (array);

    return farray;
}